

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O2

CoreType __thiscall helics::core::coreTypeFromString(core *this,string_view type)

{
  _Alloc_hider _Var1;
  int iVar2;
  CoreType CVar3;
  const_iterator pvVar4;
  char *extraout_RDX;
  size_type sVar5;
  string_view type_00;
  string_view type_local;
  string type2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  type_local._M_str = (char *)type._M_len;
  if (this == (core *)0x0) {
    CVar3 = DEFAULT;
  }
  else {
    type_local._M_len = (size_t)this;
    if ((type_local._M_str + -1)[(long)this] == '_') {
      type_local._M_len = (size_t)(this + -1);
    }
    pvVar4 = frozen::
             unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
             ::find<std::basic_string_view<char,std::char_traits<char>>>
                       ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::CoreType,_57UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         *)coreTypes,&type_local);
    if (pvVar4 == (const_iterator)(coreTypes + 0x560)) {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&type2,&type_local,(allocator<char> *)&local_40);
      _Var1 = type2._M_dataplus;
      for (sVar5 = 0; type2._M_string_length != sVar5; sVar5 = sVar5 + 1) {
        iVar2 = tolower((int)_Var1._M_p[sVar5]);
        _Var1._M_p[sVar5] = (char)iVar2;
      }
      pvVar4 = frozen::
               unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
               ::find<std::__cxx11::string>
                         ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::CoreType,_57UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)coreTypes,&type2);
      if (pvVar4 == (const_iterator)(coreTypes + 0x560)) {
        if ((byte)(*type2._M_dataplus._M_p | 0x10U) == 0x3d) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_40,&type2,1,0xffffffffffffffff);
          type_00._M_str = extraout_RDX;
          type_00._M_len = (size_t)local_40._M_dataplus._M_p;
          CVar3 = coreTypeFromString((core *)local_40._M_string_length,type_00);
          std::__cxx11::string::~string((string *)&local_40);
        }
        else {
          iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                            (&type_local,0,5,"zmqss");
          CVar3 = ZMQ_SS;
          if (((iVar2 != 0) &&
              (iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                 (&type_local,0,6,"zmq_ss"), iVar2 != 0)) &&
             (iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                (&type_local,0,4,"zmq2"), iVar2 != 0)) {
            iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                              (&type_local,0,3,"zmq");
            if (iVar2 == 0) {
              CVar3 = ZMQ;
            }
            else {
              iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                (&type_local,0,3,"ipc");
              if (iVar2 == 0) {
                CVar3 = INTERPROCESS;
              }
              else {
                iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  (&type_local,0,4,"test");
                if (iVar2 == 0) {
                  CVar3 = TEST;
                }
                else {
                  iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                    (&type_local,0,5,"tcpss");
                  if (iVar2 == 0) {
                    CVar3 = TCP_SS;
                  }
                  else {
                    iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                      (&type_local,0,3,"tcp");
                    if (iVar2 == 0) {
                      CVar3 = TCP;
                    }
                    else {
                      iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                        (&type_local,0,3,"udp");
                      if (iVar2 == 0) {
                        CVar3 = UDP;
                      }
                      else {
                        iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                          (&type_local,0,4,"http");
                        if (iVar2 == 0) {
                          CVar3 = HTTP;
                        }
                        else {
                          iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                  compare(&type_local,0,3,"mpi");
                          if (iVar2 == 0) {
                            CVar3 = MPI;
                          }
                          else {
                            iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                    compare(&type_local,0,6,"inproc");
                            if (iVar2 == 0) {
                              CVar3 = INPROC;
                            }
                            else {
                              iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                      compare(&type_local,0,3,"web");
                              if (iVar2 == 0) {
                                CVar3 = WEBSOCKET;
                              }
                              else {
                                iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                        compare(&type_local,0,4,"null");
                                CVar3 = UNRECOGNIZED;
                                if (iVar2 == 0) {
                                  CVar3 = NULLCORE;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        CVar3 = pvVar4->second;
      }
      std::__cxx11::string::~string((string *)&type2);
    }
    else {
      CVar3 = pvVar4->second;
    }
  }
  return CVar3;
}

Assistant:

CoreType coreTypeFromString(std::string_view type) noexcept
{
    if (type.empty()) {
        return CoreType::DEFAULT;
    }
    // in case it came from the to_string(CoreType)
    if (type.back() == '_') {
        type.remove_suffix(1);
    }
    const auto* fnd = coreTypes.find(type);
    if (fnd != coreTypes.end()) {
        return fnd->second;
    }
    std::string type2{type};
    std::transform(type2.cbegin(), type2.cend(), type2.begin(), ::tolower);
    fnd = coreTypes.find(type2);
    if (fnd != coreTypes.end()) {
        return fnd->second;
    }
    if ((type2.front() == '=') || (type2.front() == '-')) {
        return coreTypeFromString(type2.substr(1));
    }
    if (type.compare(0, 5, "zmqss") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 6, "zmq_ss") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 4, "zmq2") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 3, "zmq") == 0) {
        return CoreType::ZMQ;
    }
    if (type.compare(0, 3, "ipc") == 0) {
        return CoreType::INTERPROCESS;
    }
    if (type.compare(0, 4, "test") == 0) {
        return CoreType::TEST;
    }
    if (type.compare(0, 5, "tcpss") == 0) {
        return CoreType::TCP_SS;
    }
    if (type.compare(0, 3, "tcp") == 0) {
        return CoreType::TCP;
    }
    if (type.compare(0, 3, "udp") == 0) {
        return CoreType::UDP;
    }
    if (type.compare(0, 4, "http") == 0) {
        return CoreType::HTTP;
    }
    if (type.compare(0, 3, "mpi") == 0) {
        return CoreType::MPI;
    }
    if (type.compare(0, 6, "inproc") == 0) {
        return CoreType::INPROC;
    }
    if (type.compare(0, 3, "web") == 0) {
        return CoreType::WEBSOCKET;
    }
    if (type.compare(0, 4, "null") == 0) {
        return CoreType::NULLCORE;
    }

    return CoreType::UNRECOGNIZED;
}